

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O2

void __thiscall flow::TargetCodeGenerator::pop(TargetCodeGenerator *this,size_t count)

{
  FILE *__stream;
  size_type sVar1;
  bool bVar2;
  allocator<char> local_31;
  undefined8 local_30 [4];
  
  sVar1 = std::deque<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>::size(&this->stack_)
  ;
  __stream = _stderr;
  if (sVar1 < count) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_30,"flow: BUG: stack smaller than amount of elements to pop.",
               &local_31);
    fprintf(__stream,"%s\n",local_30[0]);
    std::__cxx11::string::~string((string *)local_30);
    abort();
  }
  while (bVar2 = count != 0, count = count - 1, bVar2) {
    std::deque<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>::pop_back(&this->stack_);
  }
  return;
}

Assistant:

void TargetCodeGenerator::pop(size_t count) {
  FLOW_ASSERT(count <= stack_.size(), "flow: BUG: stack smaller than amount of elements to pop.");

  for (size_t i = 0; i != count; i++)
    stack_.pop_back();
}